

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 jx9CompileStatic(jx9_gen_state *pGen)

{
  sxu32 nLine;
  SyToken *pSVar1;
  SyToken *pSVar2;
  void *pvVar3;
  SyToken *pSVar4;
  SySet *pSVar5;
  sxi32 sVar6;
  sxi32 sVar7;
  GenBlock *pGVar8;
  SySet *pSVar9;
  char *local_60;
  uint local_58;
  SySet local_50;
  undefined4 local_28;
  
  pGVar8 = pGen->pCurrent;
  pSVar1 = pGen->pIn;
  nLine = pSVar1->nLine;
  pSVar4 = pSVar1 + 1;
  pGen->pIn = pSVar4;
  do {
    if (pGVar8 == (GenBlock *)0x0) {
      if ((pSVar4 < pGen->pEnd) && ((pSVar1[1].nType & 0x10) != 0)) {
        sVar6 = jx9CompileExpr(pGen,0,(_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
        if (sVar6 != -10) {
          if (sVar6 != -3) {
            jx9VmEmitInstr(pGen->pVm,0xb,1,0,(void *)0x0,(sxu32 *)0x0);
          }
LAB_00126e87:
          sVar6 = 0;
        }
      }
      else {
LAB_00126fb9:
        sVar7 = jx9GenCompileError(pGen,1,nLine,"Expected variable after \'static\' keyword");
        sVar6 = -10;
        if (sVar7 != -10) {
LAB_00126fdd:
          pSVar4 = pGen->pIn;
          while ((sVar6 = 0, pSVar4 < pGen->pEnd && (sVar6 = 0, (pSVar4->nType & 0x40000) == 0))) {
            pGen->pIn = pSVar4 + 1;
            pSVar4 = pSVar4 + 1;
          }
        }
      }
      return sVar6;
    }
    if ((pGVar8->iFlags & 8) != 0) {
      pSVar2 = pGen->pEnd;
      if ((((pSVar2 <= pSVar4) || ((pSVar1[1].nType & 0x10) == 0)) || (pSVar2 <= pSVar1 + 2)) ||
         ((pSVar1[2].nType & 0xc) == 0)) goto LAB_00126fb9;
      pvVar3 = pGVar8->pUserData;
      pGen->pIn = pSVar1 + 3;
      if ((pSVar1 + 3 < pSVar2) && ((pSVar1[3].nType & 0x440000) == 0)) {
        jx9GenCompileError(pGen,1,pSVar1[3].nLine,"static: Unexpected token \'%z\'");
        goto LAB_00126fdd;
      }
      local_50.pAllocator = &pGen->pVm->sAllocator;
      local_50.nUsed = 0;
      local_50.nSize = 0;
      local_50.eSize = 0x18;
      local_50.nCursor = 0;
      local_50.pBase = (void *)0x0;
      local_50.pUserData = (void *)0x0;
      local_28 = 0xffffffff;
      local_60 = SyMemBackendStrDup(local_50.pAllocator,pSVar1[2].sData.zString,
                                    pSVar1[2].sData.nByte);
      if (local_60 == (char *)0x0) {
        jx9GenCompileError(pGen,1,nLine,"Fatal, JX9 engine is running out of memory");
        return -10;
      }
      local_58 = pSVar1[2].sData.nByte;
      pSVar4 = pGen->pIn;
      if ((pSVar4 < pGen->pEnd) && ((pSVar4->nType & 0x400000) != 0)) {
        pGen->pIn = pSVar4 + 1;
        pSVar5 = pGen->pVm->pByteContainer;
        pGen->pVm->pByteContainer = &local_50;
        sVar6 = jx9CompileExpr(pGen,0,(_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
        jx9VmEmitInstr(pGen->pVm,1,(uint)(sVar6 != -3),0,(void *)0x0,(sxu32 *)0x0);
        pSVar9 = &pGen->pVm->aByteCode;
        if (pSVar5 != (SySet *)0x0) {
          pSVar9 = pSVar5;
        }
        pGen->pVm->pByteContainer = pSVar9;
      }
      SySetPut((SySet *)((long)pvVar3 + 0x28),&local_60);
      goto LAB_00126e87;
    }
    pGVar8 = pGVar8->pParent;
  } while( true );
}

Assistant:

static sxi32 jx9CompileStatic(jx9_gen_state *pGen)
{
	jx9_vm_func_static_var sStatic; /* Structure describing the static variable */
	jx9_vm_func *pFunc;             /* Enclosing function */
	GenBlock *pBlock;
	SyString *pName;
	char *zDup;
	sxu32 nLine;
	sxi32 rc;
	/* Jump the static keyword */
	nLine = pGen->pIn->nLine;
	pGen->pIn++;
	/* Extract the enclosing function if any */
	pBlock = pGen->pCurrent;
	while( pBlock ){
		if( pBlock->iFlags & GEN_BLOCK_FUNC){
			break;
		}
		/* Point to the upper block */
		pBlock = pBlock->pParent;
	}
	if( pBlock == 0 ){
		/* Static statement, called outside of a function body, treat it as a simple variable. */
		if( pGen->pIn >= pGen->pEnd || (pGen->pIn->nType & JX9_TK_DOLLAR) == 0 ){
			rc = jx9GenCompileError(&(*pGen), E_ERROR, nLine, "Expected variable after 'static' keyword");
			if( rc == SXERR_ABORT ){
				return SXERR_ABORT;
			}
			goto Synchronize;
		}
		/* Compile the expression holding the variable */
		rc = jx9CompileExpr(&(*pGen), 0, 0);
		if( rc == SXERR_ABORT ){
			return SXERR_ABORT;
		}else if( rc != SXERR_EMPTY ){
			/* Emit the POP instruction */
			jx9VmEmitInstr(pGen->pVm, JX9_OP_POP, 1, 0, 0, 0);
		}
		return SXRET_OK;
	}
	pFunc = (jx9_vm_func *)pBlock->pUserData;
	/* Make sure we are dealing with a valid statement */
	if( pGen->pIn >= pGen->pEnd || (pGen->pIn->nType & JX9_TK_DOLLAR) == 0 || &pGen->pIn[1] >= pGen->pEnd ||
		(pGen->pIn[1].nType & (JX9_TK_ID|JX9_TK_KEYWORD)) == 0 ){
			rc = jx9GenCompileError(&(*pGen), E_ERROR, nLine, "Expected variable after 'static' keyword");
			if( rc == SXERR_ABORT ){
				return SXERR_ABORT;
			}
			goto Synchronize;
	}
	pGen->pIn++;
	/* Extract variable name */
	pName = &pGen->pIn->sData;
	pGen->pIn++; /* Jump the var name */
	if( pGen->pIn < pGen->pEnd && (pGen->pIn->nType & (JX9_TK_SEMI/*';'*/|JX9_TK_EQUAL/*'='*/)) == 0 ){
		rc = jx9GenCompileError(&(*pGen), E_ERROR, pGen->pIn->nLine, "static: Unexpected token '%z'", &pGen->pIn->sData);
		goto Synchronize;
	}
	/* Initialize the structure describing the static variable */
	SySetInit(&sStatic.aByteCode, &pGen->pVm->sAllocator, sizeof(VmInstr));
	sStatic.nIdx = SXU32_HIGH; /* Not yet created */
	/* Duplicate variable name */
	zDup = SyMemBackendStrDup(&pGen->pVm->sAllocator, pName->zString, pName->nByte);
	if( zDup == 0 ){
		jx9GenCompileError(&(*pGen), E_ERROR, nLine, "Fatal, JX9 engine is running out of memory");
		return SXERR_ABORT;
	}
	SyStringInitFromBuf(&sStatic.sName, zDup, pName->nByte);
	/* Check if we have an expression to compile */
	if( pGen->pIn < pGen->pEnd && (pGen->pIn->nType & JX9_TK_EQUAL) ){
		SySet *pInstrContainer;
		pGen->pIn++; /* Jump the equal '=' sign */
		/* Swap bytecode container */
		pInstrContainer = jx9VmGetByteCodeContainer(pGen->pVm);
		jx9VmSetByteCodeContainer(pGen->pVm, &sStatic.aByteCode);
		/* Compile the expression */
		rc = jx9CompileExpr(&(*pGen), 0, 0);
		/* Emit the done instruction */
		jx9VmEmitInstr(pGen->pVm, JX9_OP_DONE, (rc != SXERR_EMPTY ? 1 : 0), 0, 0, 0);
		/* Restore default bytecode container */
		jx9VmSetByteCodeContainer(pGen->pVm, pInstrContainer);
	}
	/* Finally save the compiled static variable in the appropriate container */
	SySetPut(&pFunc->aStatic, (const void *)&sStatic);
	return SXRET_OK;
Synchronize:
	/* Synchronize with the first semi-colon ';', so we can avoid compiling this erroneous
	 * statement. 
	 */
	while(pGen->pIn < pGen->pEnd && (pGen->pIn->nType & JX9_TK_SEMI) ==  0 ){
		pGen->pIn++;
	}
	return SXRET_OK;
}